

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O0

void __thiscall MidiPlayerDialog::handlePlaybackFinished(MidiPlayerDialog *this,bool successful)

{
  undefined8 uVar1;
  byte bVar2;
  int iVar3;
  Master *this_00;
  QSettings *pQVar4;
  QListWidgetItem *pQVar5;
  QString local_e8;
  QFileInfo local_d0 [8];
  QString local_c8;
  QString local_b0;
  QVariant local_98;
  QString local_78;
  QVariant local_60;
  QString local_30;
  int local_18;
  byte local_11;
  int rowPlaying;
  bool successful_local;
  MidiPlayerDialog *this_local;
  
  local_11 = successful;
  _rowPlaying = this;
  QSpinBox::setValue((int)*(undefined8 *)(this->ui + 0xb0));
  if ((local_11 & 1) == 0) {
    this->stopped = true;
  }
  else {
    if ((this->stopped & 1U) == 0) {
      iVar3 = QListWidget::row(*(QListWidgetItem **)(this->ui + 0x18));
      local_18 = iVar3 + 1;
      if ((iVar3 == -1) || (iVar3 = QListWidget::count(), iVar3 <= local_18)) {
        this->currentItem = (QListWidgetItem *)0x0;
        iVar3 = QListWidget::count();
        if (0 < iVar3) {
          QListWidget::setCurrentRow((int)*(undefined8 *)(this->ui + 0x18));
        }
        this->stopped = true;
        updateCurrentItem(this);
        return;
      }
      QListWidget::setCurrentRow((int)*(undefined8 *)(this->ui + 0x18));
      pQVar5 = (QListWidgetItem *)QListWidget::currentItem();
      this->currentItem = pQVar5;
      updateCurrentItem(this);
    }
    else {
      this->stopped = false;
      uVar1 = *(undefined8 *)(this->ui + 0x18);
      QListWidget::row(*(QListWidgetItem **)(this->ui + 0x18));
      QListWidget::setCurrentRow((int)uVar1);
    }
    QListWidgetItem::text(&local_30,this->currentItem);
    SMFDriver::start(&this->smfDriver,&local_30);
    QString::~QString(&local_30);
    this_00 = Master::getInstance();
    pQVar4 = Master::getSettings(this_00);
    QString::QString(&local_78,"Master/showConnectionBalloons");
    QVariant::QVariant(&local_98,"1");
    QSettings::value((QString *)&local_60,(QVariant *)pQVar4);
    bVar2 = QVariant::toBool();
    QVariant::~QVariant(&local_60);
    QVariant::~QVariant(&local_98);
    QString::~QString(&local_78);
    if ((bVar2 & 1) != 0) {
      QString::QString(&local_b0,"Playing MIDI file");
      pQVar5 = (QListWidgetItem *)QListWidget::currentItem();
      QListWidgetItem::text(&local_e8,pQVar5);
      QFileInfo::QFileInfo(local_d0,(QString *)&local_e8);
      QFileInfo::fileName();
      playbackStarted(this,&local_b0,&local_c8);
      QString::~QString(&local_c8);
      QFileInfo::~QFileInfo(local_d0);
      QString::~QString(&local_e8);
      QString::~QString(&local_b0);
    }
  }
  return;
}

Assistant:

void MidiPlayerDialog::handlePlaybackFinished(bool successful) {
	ui->tempoSpinBox->setValue(MidiParser::DEFAULT_BPM);
	if (!successful) {
		stopped = true;
		return;
	}
	if (stopped) {
		stopped = false;
		ui->playList->setCurrentRow(ui->playList->row(currentItem));
	} else {
		int rowPlaying = ui->playList->row(currentItem);
		if (rowPlaying++ == -1 || ui->playList->count() <= rowPlaying) {
			currentItem = NULL;
			if (ui->playList->count() > 0) {
				ui->playList->setCurrentRow(0);
			}
			stopped = true;
			updateCurrentItem();
			return;
		}
		ui->playList->setCurrentRow(rowPlaying);
		currentItem = ui->playList->currentItem();
		updateCurrentItem();
	}
	smfDriver.start(currentItem->text());
	if (Master::getInstance()->getSettings()->value("Master/showConnectionBalloons", "1").toBool()) {
		emit playbackStarted("Playing MIDI file", QFileInfo(ui->playList->currentItem()->text()).fileName());
	}
}